

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-multiple-listen.c
# Opt level: O1

int run_test_multiple_listen(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_loop_t *puVar2;
  uv_connect_t *req;
  int iVar3;
  undefined1 *__ptr;
  uv_handle_t *handle;
  int64_t eval_a;
  int64_t eval_b;
  sockaddr_in addr;
  undefined1 auStack_50 [56];
  uv__queue *local_18 [2];
  
  iVar3 = (int)auStack_50 + 0x28;
  auStack_50._32_8_ = (uv__queue *)0x1aa4bb;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)local_18);
  auStack_50._40_8_ = SEXT48(iVar1);
  auStack_50._48_8_ = (uv_handle_t *)0x0;
  if ((uv__queue *)auStack_50._40_8_ == (uv__queue *)0x0) {
    auStack_50._32_8_ = (uv__queue *)0x1aa4de;
    puVar2 = uv_default_loop();
    auStack_50._32_8_ = (uv__queue *)0x1aa4ed;
    iVar1 = uv_tcp_init(puVar2,&server);
    auStack_50._40_8_ = SEXT48(iVar1);
    auStack_50._48_8_ = (uv_handle_t *)0x0;
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x0) goto LAB_001aa73d;
    auStack_50._32_8_ = (uv__queue *)0x1aa51e;
    iVar1 = uv_tcp_bind(&server,(sockaddr *)local_18,0);
    auStack_50._40_8_ = SEXT48(iVar1);
    auStack_50._48_8_ = (uv_handle_t *)0x0;
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x0) goto LAB_001aa74a;
    auStack_50._32_8_ = (uv__queue *)0x1aa554;
    iVar1 = uv_listen((uv_stream_t *)&server,0x80,connection_cb);
    auStack_50._40_8_ = SEXT48(iVar1);
    auStack_50._48_8_ = (uv_handle_t *)0x0;
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x0) goto LAB_001aa757;
    auStack_50._32_8_ = (uv__queue *)0x1aa58a;
    iVar1 = uv_listen((uv_stream_t *)&server,0x80,connection_cb);
    auStack_50._40_8_ = SEXT48(iVar1);
    auStack_50._48_8_ = (uv_handle_t *)0x0;
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x0) goto LAB_001aa764;
    auStack_50._32_8_ = (uv__queue *)0x1aa5b2;
    req = (uv_connect_t *)malloc(0x68);
    auStack_50._32_8_ = (uv__queue *)0x1aa5cb;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)local_18);
    auStack_50._40_8_ = SEXT48(iVar1);
    auStack_50._48_8_ = (uv_handle_t *)0x0;
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x0) goto LAB_001aa771;
    if (req == (uv_connect_t *)0x0) goto LAB_001aa77e;
    auStack_50._32_8_ = (uv__queue *)0x1aa5f7;
    puVar2 = uv_default_loop();
    auStack_50._32_8_ = (uv__queue *)0x1aa606;
    iVar1 = uv_tcp_init(puVar2,&client);
    auStack_50._40_8_ = SEXT48(iVar1);
    auStack_50._48_8_ = (uv_handle_t *)0x0;
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x0) goto LAB_001aa783;
    auStack_50._32_8_ = (uv__queue *)0x1aa63f;
    iVar1 = uv_tcp_connect(req,&client,(sockaddr *)local_18,connect_cb);
    auStack_50._40_8_ = SEXT48(iVar1);
    auStack_50._48_8_ = (uv_handle_t *)0x0;
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x0) goto LAB_001aa790;
    auStack_50._32_8_ = (uv__queue *)0x1aa662;
    puVar2 = uv_default_loop();
    auStack_50._32_8_ = (uv__queue *)0x1aa66c;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_18[0] = (uv__queue *)0x1;
    auStack_50._40_8_ = SEXT48(connection_cb_called);
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x1) goto LAB_001aa79d;
    local_18[0] = (uv__queue *)0x1;
    auStack_50._40_8_ = SEXT48(connect_cb_called);
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x1) goto LAB_001aa7aa;
    local_18[0] = (uv__queue *)0x2;
    auStack_50._40_8_ = SEXT48(close_cb_called);
    if ((uv__queue *)auStack_50._40_8_ == (uv__queue *)0x2) {
      auStack_50._32_8_ = (uv__queue *)0x1aa6da;
      puVar2 = uv_default_loop();
      auStack_50._32_8_ = (uv__queue *)0x1aa6ee;
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      auStack_50._32_8_ = (uv__queue *)0x1aa6f8;
      uv_run(puVar2,UV_RUN_DEFAULT);
      local_18[0] = (uv__queue *)0x0;
      auStack_50._32_8_ = (uv__queue *)0x1aa706;
      puVar2 = uv_default_loop();
      auStack_50._32_8_ = (uv__queue *)0x1aa70e;
      iVar1 = uv_loop_close(puVar2);
      auStack_50._40_8_ = SEXT48(iVar1);
      if (local_18[0] == (uv__queue *)auStack_50._40_8_) {
        auStack_50._32_8_ = (uv__queue *)0x1aa728;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001aa7c4;
    }
  }
  else {
    auStack_50._32_8_ = (uv__queue *)0x1aa73d;
    run_test_multiple_listen_cold_1();
LAB_001aa73d:
    auStack_50._32_8_ = (uv__queue *)0x1aa74a;
    run_test_multiple_listen_cold_2();
LAB_001aa74a:
    auStack_50._32_8_ = (uv__queue *)0x1aa757;
    run_test_multiple_listen_cold_3();
LAB_001aa757:
    auStack_50._32_8_ = (uv__queue *)0x1aa764;
    run_test_multiple_listen_cold_4();
LAB_001aa764:
    auStack_50._32_8_ = (uv__queue *)0x1aa771;
    run_test_multiple_listen_cold_5();
LAB_001aa771:
    auStack_50._32_8_ = (uv__queue *)0x1aa77e;
    run_test_multiple_listen_cold_6();
LAB_001aa77e:
    auStack_50._32_8_ = (uv__queue *)0x1aa783;
    run_test_multiple_listen_cold_13();
LAB_001aa783:
    auStack_50._32_8_ = (uv__queue *)0x1aa790;
    run_test_multiple_listen_cold_7();
LAB_001aa790:
    auStack_50._32_8_ = (uv__queue *)0x1aa79d;
    run_test_multiple_listen_cold_8();
LAB_001aa79d:
    auStack_50._32_8_ = (uv__queue *)0x1aa7aa;
    run_test_multiple_listen_cold_9();
LAB_001aa7aa:
    auStack_50._32_8_ = (uv__queue *)0x1aa7b7;
    run_test_multiple_listen_cold_10();
  }
  auStack_50._32_8_ = (uv__queue *)0x1aa7c4;
  run_test_multiple_listen_cold_11();
LAB_001aa7c4:
  auStack_50._32_8_ = connection_cb;
  run_test_multiple_listen_cold_12();
  auStack_50._32_8_ = SEXT48(iVar3);
  auStack_50._24_8_ = (uv_close_cb)0x0;
  if ((uv__queue *)auStack_50._32_8_ == (uv__queue *)0x0) {
    auStack_50._8_8_ = (uv_loop_t *)0x1aa805;
    uv_close((uv_handle_t *)&server,close_cb);
    connection_cb_called = connection_cb_called + 1;
    return extraout_EAX;
  }
  __ptr = auStack_50 + 0x20;
  iVar1 = (int)auStack_50 + 0x18;
  auStack_50._8_8_ = close_cb;
  connection_cb_cold_1();
  if (__ptr != (undefined1 *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_00;
  }
  auStack_50._0_8_ = connect_cb;
  close_cb_cold_1();
  if (__ptr == (undefined1 *)0x0) {
    connect_cb_cold_2();
  }
  else {
    auStack_50._0_8_ = SEXT48(iVar1);
    if ((code *)auStack_50._0_8_ == (code *)0x0) {
      free(__ptr);
      uv_close((uv_handle_t *)&client,close_cb);
      connect_cb_called = connect_cb_called + 1;
      return extraout_EAX_01;
    }
  }
  handle = (uv_handle_t *)auStack_50;
  connect_cb_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_02;
}

Assistant:

static void start_server(void) {
  struct sockaddr_in addr;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server, 128, connection_cb);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server, 128, connection_cb);
  ASSERT_OK(r);
}